

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u_init.c
# Opt level: O0

void save_you(memfile *mf,you *y)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  uint local_44;
  uint local_34;
  uint hflags;
  uint eflags;
  uint yflags;
  int i;
  you *y_local;
  memfile *mf_local;
  
  bVar1 = y->field_0x41c;
  bVar2 = y->field_0x41c;
  bVar3 = y->field_0x41c;
  bVar4 = y->field_0x41c;
  bVar5 = y->field_0x41c;
  bVar6 = y->field_0x41c;
  bVar7 = y->field_0x41c;
  bVar8 = y->field_0x3cb;
  bVar9 = y->field_0x3e4;
  bVar10 = y->field_0x3e4;
  bVar11 = y->field_0x3e4;
  bVar12 = y->field_0x3e4;
  bVar13 = y->field_0x41c;
  uVar19 = *(ushort *)&y->uevent;
  uVar20 = *(ushort *)&y->uevent;
  uVar21 = *(ushort *)&y->uevent;
  uVar22 = *(ushort *)&y->uevent;
  uVar23 = *(ushort *)&y->uevent;
  uVar24 = *(ushort *)&y->uevent;
  uVar25 = *(ushort *)&y->uevent;
  uVar26 = *(ushort *)&y->uevent;
  uVar27 = *(ushort *)&y->uevent;
  uVar28 = *(ushort *)&y->uevent;
  uVar29 = *(ushort *)&y->uevent;
  uVar30 = *(ushort *)&y->uevent;
  uVar31 = *(ushort *)&y->uevent;
  bVar14 = *(byte *)&y->uhave;
  bVar15 = *(byte *)&y->uhave;
  bVar16 = *(byte *)&y->uhave;
  bVar17 = *(byte *)&y->uhave;
  bVar18 = *(byte *)&y->uhave;
  mtag(mf,0,MTAG_YOU);
  mwrite32(mf,(uint)(bVar1 & 1) << 0x1f | (uint)(bVar2 >> 1 & 1) << 0x1e |
              (uint)(bVar3 >> 2 & 1) << 0x1d | (uint)(bVar4 >> 3 & 1) << 0x1c |
              (uint)(bVar5 >> 4 & 1) << 0x1b | (uint)(bVar6 >> 5 & 1) << 0x1a |
              (uint)(bVar7 >> 6 & 1) << 0x19 | (uint)(bVar8 & 3) << 0x17 | (uint)(bVar9 & 1) << 0x16
              | (uint)(bVar10 >> 1 & 1) << 0x15 | (uint)(bVar11 >> 2 & 1) << 0x14 |
              (uint)(bVar12 >> 3 & 1) << 0x13 | (uint)(bVar13 >> 7) << 0x12);
  mwrite32(mf,(uint)(uVar19 & 1) << 0x1f | (uint)(uVar20 >> 1 & 1) << 0x1e |
              (uint)(uVar21 >> 2 & 1) << 0x1d | (uint)(uVar22 >> 3 & 1) << 0x1c |
              (uint)(uVar23 >> 4 & 1) << 0x1b | (uint)(uVar24 >> 5 & 1) << 0x1a |
              (uint)(uVar25 >> 6 & 3) << 0x18 | (uint)(uVar26 >> 8 & 1) << 0x17 |
              (uint)(uVar27 >> 9 & 1) << 0x16 | (uint)(uVar28 >> 10 & 1) << 0x15 |
              (uint)(uVar29 >> 0xb & 3) << 0x13 | (uint)(uVar30 >> 0xd & 1) << 0x12 |
              (uint)(uVar31 >> 0xe & 1) << 0x11);
  mwrite32(mf,(uint)(bVar14 & 1) << 0x1f | (uint)(bVar15 >> 1 & 1) << 0x1e |
              (uint)(bVar16 >> 2 & 1) << 0x1d | (uint)(bVar17 >> 3 & 1) << 0x1c |
              (uint)(bVar18 >> 4 & 1) << 0x1b);
  mwrite32(mf,y->uhp);
  mwrite32(mf,y->uhpmax);
  mwrite32(mf,y->uen);
  mwrite32(mf,y->uenmax);
  mwrite32(mf,y->ulevel);
  mwrite32(mf,y->umoney0);
  mwrite32(mf,y->uexp);
  mwrite32(mf,y->urexp);
  mwrite32(mf,y->ulevelmax);
  mwrite32(mf,y->umonster);
  mwrite32(mf,y->umonnum);
  mwrite32(mf,y->mh);
  mwrite32(mf,y->mhmax);
  mwrite32(mf,y->mtimedone);
  mwrite32(mf,y->ulycn);
  mwrite32(mf,y->last_str_turn);
  mwrite32(mf,y->utrap);
  mwrite32(mf,y->utraptype);
  mwrite32(mf,y->uhunger);
  mwrite32(mf,y->uhs);
  mwrite32(mf,y->umconf);
  mwrite32(mf,y->nv_range);
  mwrite32(mf,y->xray_range);
  mwrite32(mf,y->bglyph);
  mwrite32(mf,y->cglyph);
  mwrite32(mf,y->bobjmn);
  mwrite32(mf,y->cobjmn);
  mwrite32(mf,y->bc_order);
  mwrite32(mf,y->bc_felt);
  mwrite32(mf,y->ucreamed);
  mwrite32(mf,y->uswldtim);
  mwrite32(mf,y->udg_cnt);
  mwrite32(mf,y->next_attr_check);
  mwrite32(mf,(y->ualign).record);
  mwrite32(mf,y->ugangr);
  mwrite32(mf,y->ugifts);
  mwrite32(mf,y->ublessed);
  mwrite32(mf,y->ublesscnt);
  mwrite32(mf,y->ucleansed);
  mwrite32(mf,y->usleep);
  mwrite32(mf,y->uinvault);
  mwrite32(mf,y->ugallop);
  mwrite32(mf,y->urideturns);
  mwrite32(mf,y->uarmortrain);
  mwrite32(mf,y->ushieldtrain);
  mwrite32(mf,y->umortality);
  mwrite32(mf,y->ugrave_arise);
  mwrite64(mf,y->ubirthday);
  mwrite32(mf,y->weapon_slots);
  mwrite32(mf,y->skills_advanced);
  mwrite32(mf,y->initrole);
  mwrite32(mf,y->initrace);
  mwrite32(mf,y->initgend);
  mwrite32(mf,y->initalign);
  mwrite32(mf,(y->uconduct).unvegetarian);
  mwrite32(mf,(y->uconduct).unvegan);
  mwrite32(mf,(y->uconduct).food);
  mwrite32(mf,(y->uconduct).gnostic);
  mwrite32(mf,(y->uconduct).weaphit);
  mwrite32(mf,(y->uconduct).killer);
  mwrite32(mf,(y->uconduct).literate);
  mwrite32(mf,(y->uconduct).polypiles);
  mwrite32(mf,(y->uconduct).polyselfs);
  mwrite32(mf,(y->uconduct).wishes);
  mwrite32(mf,(y->uconduct).wisharti);
  mwrite32(mf,(y->uconduct).wishmagic);
  mwrite32(mf,(y->uconduct).armoruses);
  mwrite32(mf,(y->uconduct).unblinded);
  mwrite32(mf,(y->uconduct).robbed);
  mwrite32(mf,(y->uconduct).elbereths);
  mwrite32(mf,(y->uconduct).bones);
  mwrite32(mf,(y->uconduct).unracearmor);
  mwrite32(mf,(y->uconduct).sokoban);
  mwrite8(mf,(y->roleplay).ascet);
  mwrite8(mf,(y->roleplay).atheist);
  mwrite8(mf,(y->roleplay).blindfolded);
  mwrite8(mf,(y->roleplay).illiterate);
  mwrite8(mf,(y->roleplay).pacifist);
  mwrite8(mf,(y->roleplay).sadist);
  mwrite8(mf,(y->roleplay).nudist);
  mwrite8(mf,(y->roleplay).vegan);
  mwrite8(mf,(y->roleplay).vegetarian);
  if (y->ustuck == (monst *)0x0) {
    local_34 = 0;
  }
  else {
    local_34 = y->ustuck->m_id;
  }
  mwrite32(mf,local_34);
  if (y->usteed == (monst *)0x0) {
    local_44 = 0;
  }
  else {
    local_44 = y->usteed->m_id;
  }
  mwrite32(mf,local_44);
  mwrite8(mf,y->ux);
  mwrite8(mf,y->uy);
  mwrite8(mf,y->dx);
  mwrite8(mf,y->dy);
  mwrite8(mf,y->tx);
  mwrite8(mf,y->ty);
  mwrite8(mf,y->ux0);
  mwrite8(mf,y->uy0);
  mwrite8(mf,(y->uz).dnum);
  mwrite8(mf,(y->uz).dlevel);
  mwrite8(mf,(y->uz0).dnum);
  mwrite8(mf,(y->uz0).dlevel);
  mwrite8(mf,(y->utolev).dnum);
  mwrite8(mf,(y->utolev).dlevel);
  mwrite8(mf,y->utotype);
  mwrite8(mf,y->umoved);
  mwrite8(mf,(y->ualign).type);
  mwrite8(mf,y->ualignbase[0]);
  mwrite8(mf,y->ualignbase[1]);
  mwrite8(mf,y->uluck);
  mwrite8(mf,y->moreluck);
  mwrite8(mf,y->uhitinc);
  mwrite8(mf,y->udaminc);
  mwrite8(mf,y->uac);
  mwrite8(mf,y->uspellprot);
  mwrite8(mf,y->usptime);
  mwrite8(mf,y->uspmtime);
  mwrite8(mf,y->twoweap);
  mwrite(mf,y->usick_cause,0x53);
  mwrite(mf,y->urooms,5);
  mwrite(mf,y->urooms0,5);
  mwrite(mf,y->uentered,5);
  mwrite(mf,y->ushops,5);
  mwrite(mf,y->ushops0,5);
  mwrite(mf,y->ushops_entered,5);
  mwrite(mf,y->ushops_left,5);
  mwrite(mf,&y->macurr,6);
  mwrite(mf,&y->mamax,6);
  mwrite(mf,&y->acurr,6);
  mwrite(mf,&y->aexe,6);
  mwrite(mf,&y->abon,6);
  mwrite(mf,&y->amax,6);
  mwrite(mf,&y->atemp,6);
  mwrite(mf,&y->atime,6);
  mwrite(mf,y->skill_record,0x3c);
  for (eflags = 0; (int)eflags < 0x43; eflags = eflags + 1) {
    mwrite32(mf,y->uprops[(int)eflags].extrinsic);
    mwrite32(mf,y->uprops[(int)eflags].blocked);
    mwrite32(mf,y->uprops[(int)eflags].intrinsic);
  }
  for (eflags = 0; (int)eflags < 0x2a; eflags = eflags + 1) {
    mwrite8(mf,y->weapon_skills[(int)eflags].skill);
    mwrite8(mf,y->weapon_skills[(int)eflags].max_skill);
    mwrite16(mf,y->weapon_skills[(int)eflags].advance);
  }
  return;
}

Assistant:

void save_you(struct memfile *mf, struct you *y)
{
	int i;
	unsigned int yflags, eflags, hflags;
	yflags = (y->uswallow		<< 31) |
		 (y->uinwater		<< 30) |
		 (y->uundetected	<< 29) |
		 (y->mfemale		<< 28) |
		 (y->uinvulnerable	<< 27) |
		 (y->uburied		<< 26) |
		 (y->uedibility		<< 25) |
		 (y->usick_type		<< 23) |
		 (y->bstack		<< 22) |
		 (y->cstack		<< 21) |
		 (y->boprize		<< 20) |
		 (y->coprize		<< 19) |
		 (y->uwilldrown		<< 18);
	eflags = (y->uevent.minor_oracle	<< 31) |
		 (y->uevent.major_oracle	<< 30) |
		 (y->uevent.finished_sokoban	<< 29) |
		 (y->uevent.qcalled		<< 28) |
		 (y->uevent.qexpelled		<< 27) |
		 (y->uevent.qcompleted		<< 26) |
		 (y->uevent.uheard_tune		<< 24) |
		 (y->uevent.uopened_dbridge	<< 23) |
		 (y->uevent.invoked		<< 22) |
		 (y->uevent.gehennom_entered	<< 21) |
		 (y->uevent.uhand_of_elbereth	<< 19) |
		 (y->uevent.udemigod		<< 18) |
		 (y->uevent.ascended		<< 17);
	hflags = (y->uhave.amulet << 31) | (y->uhave.bell << 30) |
		(y->uhave.book << 29) | (y->uhave.menorah << 28) |
		(y->uhave.questart << 27);

	mtag(mf, 0, MTAG_YOU);
	mwrite32(mf, yflags);
	mwrite32(mf, eflags);
	mwrite32(mf, hflags);
	mwrite32(mf, y->uhp);
	mwrite32(mf, y->uhpmax);
	mwrite32(mf, y->uen);
	mwrite32(mf, y->uenmax);
	mwrite32(mf, y->ulevel);
	mwrite32(mf, y->umoney0);
	mwrite32(mf, y->uexp);
	mwrite32(mf, y->urexp);
	mwrite32(mf, y->ulevelmax);
	mwrite32(mf, y->umonster);
	mwrite32(mf, y->umonnum);
	mwrite32(mf, y->mh);
	mwrite32(mf, y->mhmax);
	mwrite32(mf, y->mtimedone);
	mwrite32(mf, y->ulycn);
	mwrite32(mf, y->last_str_turn);
	mwrite32(mf, y->utrap);
	mwrite32(mf, y->utraptype);
	mwrite32(mf, y->uhunger);
	mwrite32(mf, y->uhs);
	mwrite32(mf, y->umconf);
	mwrite32(mf, y->nv_range);
	mwrite32(mf, y->xray_range);
	mwrite32(mf, y->bglyph);
	mwrite32(mf, y->cglyph);
	mwrite32(mf, y->bobjmn);
	mwrite32(mf, y->cobjmn);
	mwrite32(mf, y->bc_order);
	mwrite32(mf, y->bc_felt);
	mwrite32(mf, y->ucreamed);
	mwrite32(mf, y->uswldtim);
	mwrite32(mf, y->udg_cnt);
	mwrite32(mf, y->next_attr_check);
	mwrite32(mf, y->ualign.record);
	mwrite32(mf, y->ugangr);
	mwrite32(mf, y->ugifts);
	mwrite32(mf, y->ublessed);
	mwrite32(mf, y->ublesscnt);
	mwrite32(mf, y->ucleansed);
	mwrite32(mf, y->usleep);
	mwrite32(mf, y->uinvault);
	mwrite32(mf, y->ugallop);
	mwrite32(mf, y->urideturns);
	mwrite32(mf, y->uarmortrain);
	mwrite32(mf, y->ushieldtrain);
	mwrite32(mf, y->umortality);
	mwrite32(mf, y->ugrave_arise);
	mwrite64(mf, y->ubirthday);
	mwrite32(mf, y->weapon_slots);
	mwrite32(mf, y->skills_advanced);
	mwrite32(mf, y->initrole);
	mwrite32(mf, y->initrace);
	mwrite32(mf, y->initgend);
	mwrite32(mf, y->initalign);
	mwrite32(mf, y->uconduct.unvegetarian);
	mwrite32(mf, y->uconduct.unvegan);
	mwrite32(mf, y->uconduct.food);
	mwrite32(mf, y->uconduct.gnostic);
	mwrite32(mf, y->uconduct.weaphit);
	mwrite32(mf, y->uconduct.killer);
	mwrite32(mf, y->uconduct.literate);
	mwrite32(mf, y->uconduct.polypiles);
	mwrite32(mf, y->uconduct.polyselfs);
	mwrite32(mf, y->uconduct.wishes);
	mwrite32(mf, y->uconduct.wisharti);
	mwrite32(mf, y->uconduct.wishmagic);
	mwrite32(mf, y->uconduct.armoruses);
	mwrite32(mf, y->uconduct.unblinded);
	mwrite32(mf, y->uconduct.robbed);
	mwrite32(mf, y->uconduct.elbereths);
	mwrite32(mf, y->uconduct.bones);
	mwrite32(mf, y->uconduct.unracearmor);
	mwrite32(mf, y->uconduct.sokoban);
	mwrite8(mf, y->roleplay.ascet);
	mwrite8(mf, y->roleplay.atheist);
	mwrite8(mf, y->roleplay.blindfolded);
	mwrite8(mf, y->roleplay.illiterate);
	mwrite8(mf, y->roleplay.pacifist);
	mwrite8(mf, y->roleplay.sadist);
	mwrite8(mf, y->roleplay.nudist);
	mwrite8(mf, y->roleplay.vegan);
	mwrite8(mf, y->roleplay.vegetarian);

	mwrite32(mf, y->ustuck ? y->ustuck->m_id : 0);
	mwrite32(mf, y->usteed ? y->usteed->m_id : 0);

	mwrite8(mf, y->ux);
	mwrite8(mf, y->uy);
	mwrite8(mf, y->dx);
	mwrite8(mf, y->dy);
	mwrite8(mf, y->tx);
	mwrite8(mf, y->ty);
	mwrite8(mf, y->ux0);
	mwrite8(mf, y->uy0);
	mwrite8(mf, y->uz.dnum);
	mwrite8(mf, y->uz.dlevel);
	mwrite8(mf, y->uz0.dnum);
	mwrite8(mf, y->uz0.dlevel);
	mwrite8(mf, y->utolev.dnum);
	mwrite8(mf, y->utolev.dlevel);
	mwrite8(mf, y->utotype);
	mwrite8(mf, y->umoved);
	mwrite8(mf, y->ualign.type);
	mwrite8(mf, y->ualignbase[0]);
	mwrite8(mf, y->ualignbase[1]);
	mwrite8(mf, y->uluck);
	mwrite8(mf, y->moreluck);
	mwrite8(mf, y->uhitinc);
	mwrite8(mf, y->udaminc);
	mwrite8(mf, y->uac);
	mwrite8(mf, y->uspellprot);
	mwrite8(mf, y->usptime);
	mwrite8(mf, y->uspmtime);
	mwrite8(mf, y->twoweap);

	mwrite(mf, y->usick_cause, sizeof(y->usick_cause));
	mwrite(mf, y->urooms, sizeof(y->urooms));
	mwrite(mf, y->urooms0, sizeof(y->urooms0));
	mwrite(mf, y->uentered, sizeof(y->uentered));
	mwrite(mf, y->ushops, sizeof(y->ushops));
	mwrite(mf, y->ushops0, sizeof(y->ushops0));
	mwrite(mf, y->ushops_entered, sizeof(y->ushops_entered));
	mwrite(mf, y->ushops_left, sizeof(y->ushops_left));
	mwrite(mf, y->macurr.a, sizeof(y->macurr.a));
	mwrite(mf, y->mamax.a, sizeof(y->mamax.a));
	mwrite(mf, y->acurr.a, sizeof(y->acurr.a));
	mwrite(mf, y->aexe.a, sizeof(y->aexe.a));
	mwrite(mf, y->abon.a, sizeof(y->abon.a));
	mwrite(mf, y->amax.a, sizeof(y->amax.a));
	mwrite(mf, y->atemp.a, sizeof(y->atemp.a));
	mwrite(mf, y->atime.a, sizeof(y->atime.a));
	mwrite(mf, y->skill_record, sizeof(y->skill_record));
    
	for (i = 0; i <= LAST_PROP; i++) {
	    mwrite32(mf, y->uprops[i].extrinsic);
	    mwrite32(mf, y->uprops[i].blocked);
	    mwrite32(mf, y->uprops[i].intrinsic);
	}
	for (i = 0; i < P_NUM_SKILLS; i++) {
	    mwrite8(mf, y->weapon_skills[i].skill);
	    mwrite8(mf, y->weapon_skills[i].max_skill);
	    mwrite16(mf, y->weapon_skills[i].advance);
	}
}